

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fNegativeTextureApiTests.cpp
# Opt level: O2

void deqp::gles31::Functional::NegativeTestShared::compressedtexsubimage2d_max_level
               (NegativeTestContext *ctx)

{
  int imageSize;
  deUint32 dVar1;
  uint uVar2;
  uint uVar3;
  int faceIterTcu_1;
  int faceIterTcu;
  CubeFace CVar4;
  allocator<char> local_51;
  string local_50;
  deUint32 textures [2];
  
  glu::CallLogWrapper::glGenTextures(&ctx->super_CallLogWrapper,2,textures);
  glu::CallLogWrapper::glBindTexture(&ctx->super_CallLogWrapper,0xde1,textures[0]);
  imageSize = etc2EacDataSize(0x12,0x12);
  glu::CallLogWrapper::glCompressedTexImage2D
            (&ctx->super_CallLogWrapper,0xde1,0,0x9278,0x12,0x12,0,imageSize,(void *)0x0);
  glu::CallLogWrapper::glBindTexture(&ctx->super_CallLogWrapper,0x8513,textures[1]);
  for (CVar4 = CUBEFACE_NEGATIVE_X; CVar4 != CUBEFACE_LAST; CVar4 = CVar4 + CUBEFACE_POSITIVE_X) {
    dVar1 = cubeFaceToGLFace(CVar4);
    glu::CallLogWrapper::glCompressedTexImage2D
              (&ctx->super_CallLogWrapper,dVar1,0,0x9278,0x12,0x12,0,imageSize,(void *)0x0);
  }
  NegativeTestContext::expectError(ctx,0);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_50,
             "GL_INVALID_VALUE is generated if level is greater than log_2(GL_MAX_TEXTURE_SIZE).",
             &local_51);
  NegativeTestContext::beginSection(ctx,&local_50);
  std::__cxx11::string::~string((string *)&local_50);
  uVar2 = NegativeTestContext::getInteger(ctx,0xd33);
  uVar3 = 0x20;
  if (uVar2 != 0) {
    uVar3 = 0x1f;
    if (uVar2 != 0) {
      for (; uVar2 >> uVar3 == 0; uVar3 = uVar3 - 1) {
      }
    }
    uVar3 = uVar3 ^ 0x1f;
  }
  glu::CallLogWrapper::glCompressedTexSubImage2D
            (&ctx->super_CallLogWrapper,0xde1,0x20 - uVar3,0,0,0,0,0x9278,0,(void *)0x0);
  NegativeTestContext::expectError(ctx,0x501);
  NegativeTestContext::endSection(ctx);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_50,
             "GL_INVALID_VALUE is generated if level is greater than log_2(GL_MAX_CUBE_MAP_TEXTURE_SIZE)."
             ,&local_51);
  NegativeTestContext::beginSection(ctx,&local_50);
  std::__cxx11::string::~string((string *)&local_50);
  uVar2 = NegativeTestContext::getInteger(ctx,0x851c);
  uVar3 = 0x20;
  if (uVar2 != 0) {
    uVar3 = 0x1f;
    if (uVar2 != 0) {
      for (; uVar2 >> uVar3 == 0; uVar3 = uVar3 - 1) {
      }
    }
    uVar3 = uVar3 ^ 0x1f;
  }
  for (CVar4 = CUBEFACE_NEGATIVE_X; CVar4 != CUBEFACE_LAST; CVar4 = CVar4 + CUBEFACE_POSITIVE_X) {
    dVar1 = cubeFaceToGLFace(CVar4);
    glu::CallLogWrapper::glCompressedTexSubImage2D
              (&ctx->super_CallLogWrapper,dVar1,0x20 - uVar3,0,0,0,0,0x9278,0,(void *)0x0);
    NegativeTestContext::expectError(ctx,0x501);
  }
  NegativeTestContext::endSection(ctx);
  glu::CallLogWrapper::glDeleteTextures(&ctx->super_CallLogWrapper,2,textures);
  return;
}

Assistant:

void compressedtexsubimage2d_max_level (NegativeTestContext& ctx)
{
	deUint32				textures[2];
	ctx.glGenTextures			(2, &textures[0]);
	ctx.glBindTexture			(GL_TEXTURE_2D, textures[0]);
	ctx.glCompressedTexImage2D	(GL_TEXTURE_2D, 0, GL_COMPRESSED_RGBA8_ETC2_EAC, 18, 18, 0, etc2EacDataSize(18, 18), 0);
	ctx.glBindTexture			(GL_TEXTURE_CUBE_MAP, textures[1]);
	FOR_CUBE_FACES(faceGL, ctx.glCompressedTexImage2D(faceGL, 0, GL_COMPRESSED_RGBA8_ETC2_EAC, 18, 18, 0, etc2EacDataSize(18, 18), 0););
	ctx.expectError				(GL_NO_ERROR);

	ctx.beginSection("GL_INVALID_VALUE is generated if level is greater than log_2(GL_MAX_TEXTURE_SIZE).");
	deUint32 log2MaxTextureSize = deLog2Floor32(ctx.getInteger(GL_MAX_TEXTURE_SIZE)) + 1;
	ctx.glCompressedTexSubImage2D(GL_TEXTURE_2D, log2MaxTextureSize, 0, 0, 0, 0, GL_COMPRESSED_RGBA8_ETC2_EAC, 0, 0);
	ctx.expectError(GL_INVALID_VALUE);
	ctx.endSection();

	ctx.beginSection("GL_INVALID_VALUE is generated if level is greater than log_2(GL_MAX_CUBE_MAP_TEXTURE_SIZE).");
	deUint32 log2MaxCubemapSize = deLog2Floor32(ctx.getInteger(GL_MAX_CUBE_MAP_TEXTURE_SIZE)) + 1;
	FOR_CUBE_FACES(faceGL,
	{
		ctx.glCompressedTexSubImage2D(faceGL, log2MaxCubemapSize, 0, 0, 0, 0, GL_COMPRESSED_RGBA8_ETC2_EAC, 0, 0);
		ctx.expectError(GL_INVALID_VALUE);
	});
	ctx.endSection();

	ctx.glDeleteTextures(2, &textures[0]);
}